

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsort.scat.c
# Opt level: O3

void ga_sort_scat(Integer *pn,void *v,Integer *i,Integer *j,Integer *base,Integer type)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined4 uVar3;
  int iVar4;
  undefined8 uVar5;
  Integer IVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  long lVar9;
  Integer *pIVar10;
  ulong uVar11;
  long *plVar12;
  ulong uVar13;
  long *plVar14;
  long lVar15;
  long lVar16;
  long *plVar17;
  long lVar18;
  long *plVar19;
  DoubleComplex dtmp;
  
  switch(type) {
  case 0x3e9:
    uVar11 = *pn;
    if (1 < (long)uVar11) {
      uVar13 = uVar11 >> 1;
      uVar11 = (ulong)((uint)uVar11 & 1);
      lVar9 = uVar13 * 0x10 + uVar11 * 8 + -8;
      if (uVar13 != 1) {
        plVar14 = base + uVar11 + uVar13 * 2 + -1;
        do {
          plVar19 = base + (uVar13 - 1) + uVar13;
          plVar12 = base + (uVar13 - 1);
          uVar11 = uVar13;
          while (plVar19 <= plVar14) {
            uVar11 = uVar11 * 2;
            if (plVar19 == plVar14) {
              lVar15 = *plVar14;
              plVar17 = plVar14;
            }
            else {
              lVar18 = *plVar19;
              lVar16 = plVar19[1];
              lVar15 = lVar18;
              if (lVar18 < lVar16) {
                lVar15 = lVar16;
              }
              plVar17 = plVar19 + 1;
              if (lVar16 <= lVar18) {
                plVar17 = plVar19;
              }
              uVar11 = uVar11 | lVar18 < lVar16;
            }
            lVar18 = *plVar12;
            if (lVar15 <= lVar18) break;
            lVar16 = (long)plVar17 - (long)base;
            *plVar12 = lVar15;
            lVar15 = (long)plVar12 - (long)base;
            *plVar17 = (long)(int)lVar18;
            uVar3 = *(undefined4 *)((long)v + (lVar15 >> 1));
            *(undefined4 *)((long)v + (lVar15 >> 1)) = *(undefined4 *)((long)v + (lVar16 >> 1));
            *(undefined4 *)((long)v + (lVar16 >> 1)) = uVar3;
            iVar4 = *(int *)((long)i + lVar15);
            *(undefined8 *)((long)i + lVar15) = *(undefined8 *)((long)i + lVar16);
            *(long *)((long)i + lVar16) = (long)iVar4;
            iVar4 = *(int *)((long)j + lVar15);
            *(undefined8 *)((long)j + lVar15) = *(undefined8 *)((long)j + lVar16);
            *(long *)((long)j + lVar16) = (long)iVar4;
            plVar12 = plVar17;
            plVar19 = plVar17 + uVar11;
          }
          uVar13 = uVar13 - 1;
        } while (uVar13 != 1);
      }
      if (lVar9 != 0) {
        do {
          if (7 < lVar9) {
            plVar14 = (long *)((long)base + lVar9);
            uVar11 = 1;
            pIVar10 = base;
            plVar19 = base + 1;
            do {
              uVar11 = uVar11 * 2;
              if (plVar19 == plVar14) {
                lVar15 = *plVar14;
                plVar12 = plVar14;
              }
              else {
                lVar18 = *plVar19;
                lVar16 = plVar19[1];
                lVar15 = lVar18;
                if (lVar18 < lVar16) {
                  lVar15 = lVar16;
                }
                plVar12 = plVar19 + 1;
                if (lVar16 <= lVar18) {
                  plVar12 = plVar19;
                }
                uVar11 = uVar11 | lVar18 < lVar16;
              }
              lVar18 = *pIVar10;
              if (lVar15 <= lVar18) break;
              lVar16 = (long)plVar12 - (long)base;
              *pIVar10 = lVar15;
              lVar15 = (long)pIVar10 - (long)base;
              *plVar12 = (long)(int)lVar18;
              uVar3 = *(undefined4 *)((long)v + (lVar15 >> 1));
              *(undefined4 *)((long)v + (lVar15 >> 1)) = *(undefined4 *)((long)v + (lVar16 >> 1));
              *(undefined4 *)((long)v + (lVar16 >> 1)) = uVar3;
              iVar4 = *(int *)((long)i + lVar15);
              *(undefined8 *)((long)i + lVar15) = *(undefined8 *)((long)i + lVar16);
              *(long *)((long)i + lVar16) = (long)iVar4;
              iVar4 = *(int *)((long)j + lVar15);
              *(undefined8 *)((long)j + lVar15) = *(undefined8 *)((long)j + lVar16);
              *(long *)((long)j + lVar16) = (long)iVar4;
              plVar19 = plVar12 + uVar11;
              pIVar10 = plVar12;
            } while (plVar19 <= plVar14);
          }
          IVar6 = *base;
          *base = *(Integer *)((long)base + lVar9);
          *(long *)((long)base + lVar9) = (long)(int)IVar6;
          uVar3 = *v;
          *(undefined4 *)v = *(undefined4 *)((long)v + (lVar9 >> 1));
          *(undefined4 *)((long)v + (lVar9 >> 1)) = uVar3;
          IVar6 = *i;
          *i = *(Integer *)((long)i + lVar9);
          *(long *)((long)i + lVar9) = (long)(int)IVar6;
          IVar6 = *j;
          *j = *(Integer *)((long)j + lVar9);
          *(long *)((long)j + lVar9) = (long)(int)IVar6;
          lVar9 = lVar9 + -8;
        } while (lVar9 != 0);
      }
    }
    break;
  case 0x3ea:
    uVar11 = *pn;
    if (1 < (long)uVar11) {
      uVar13 = uVar11 >> 1;
      uVar11 = (ulong)((uint)uVar11 & 1);
      lVar9 = uVar13 * 0x10 + uVar11 * 8 + -8;
      if (uVar13 != 1) {
        plVar14 = base + uVar11 + uVar13 * 2 + -1;
        do {
          plVar19 = base + (uVar13 - 1) + uVar13;
          plVar12 = base + (uVar13 - 1);
          uVar11 = uVar13;
          while (plVar19 <= plVar14) {
            uVar11 = uVar11 * 2;
            if (plVar19 == plVar14) {
              lVar15 = *plVar14;
              plVar17 = plVar14;
            }
            else {
              lVar18 = *plVar19;
              lVar16 = plVar19[1];
              lVar15 = lVar18;
              if (lVar18 < lVar16) {
                lVar15 = lVar16;
              }
              plVar17 = plVar19 + 1;
              if (lVar16 <= lVar18) {
                plVar17 = plVar19;
              }
              uVar11 = uVar11 | lVar18 < lVar16;
            }
            lVar18 = *plVar12;
            if (lVar15 <= lVar18) break;
            lVar16 = (long)plVar17 - (long)base;
            *plVar12 = lVar15;
            lVar15 = (long)plVar12 - (long)base;
            *plVar17 = lVar18;
            uVar5 = *(undefined8 *)((long)v + lVar15);
            *(undefined8 *)((long)v + lVar15) = *(undefined8 *)((long)v + lVar16);
            *(undefined8 *)((long)v + lVar16) = uVar5;
            uVar5 = *(undefined8 *)((long)i + lVar15);
            *(undefined8 *)((long)i + lVar15) = *(undefined8 *)((long)i + lVar16);
            *(undefined8 *)((long)i + lVar16) = uVar5;
            uVar5 = *(undefined8 *)((long)j + lVar15);
            *(undefined8 *)((long)j + lVar15) = *(undefined8 *)((long)j + lVar16);
            *(undefined8 *)((long)j + lVar16) = uVar5;
            plVar12 = plVar17;
            plVar19 = plVar17 + uVar11;
          }
          uVar13 = uVar13 - 1;
        } while (uVar13 != 1);
      }
      if (lVar9 != 0) {
        do {
          if (7 < lVar9) {
            plVar14 = (long *)((long)base + lVar9);
            uVar11 = 1;
            pIVar10 = base;
            plVar19 = base + 1;
            do {
              uVar11 = uVar11 * 2;
              if (plVar19 == plVar14) {
                lVar15 = *plVar14;
                plVar12 = plVar14;
              }
              else {
                lVar18 = *plVar19;
                lVar16 = plVar19[1];
                lVar15 = lVar18;
                if (lVar18 < lVar16) {
                  lVar15 = lVar16;
                }
                plVar12 = plVar19 + 1;
                if (lVar16 <= lVar18) {
                  plVar12 = plVar19;
                }
                uVar11 = uVar11 | lVar18 < lVar16;
              }
              lVar18 = *pIVar10;
              if (lVar15 <= lVar18) break;
              lVar16 = (long)plVar12 - (long)base;
              *pIVar10 = lVar15;
              lVar15 = (long)pIVar10 - (long)base;
              *plVar12 = lVar18;
              uVar5 = *(undefined8 *)((long)v + lVar15);
              *(undefined8 *)((long)v + lVar15) = *(undefined8 *)((long)v + lVar16);
              *(undefined8 *)((long)v + lVar16) = uVar5;
              uVar5 = *(undefined8 *)((long)i + lVar15);
              *(undefined8 *)((long)i + lVar15) = *(undefined8 *)((long)i + lVar16);
              *(undefined8 *)((long)i + lVar16) = uVar5;
              uVar5 = *(undefined8 *)((long)j + lVar15);
              *(undefined8 *)((long)j + lVar15) = *(undefined8 *)((long)j + lVar16);
              *(undefined8 *)((long)j + lVar16) = uVar5;
              plVar19 = plVar12 + uVar11;
              pIVar10 = plVar12;
            } while (plVar19 <= plVar14);
          }
          IVar6 = *base;
          *base = *(Integer *)((long)base + lVar9);
          *(Integer *)((long)base + lVar9) = IVar6;
          uVar5 = *v;
          *(undefined8 *)v = *(undefined8 *)((long)v + lVar9);
          *(undefined8 *)((long)v + lVar9) = uVar5;
          IVar6 = *i;
          *i = *(Integer *)((long)i + lVar9);
          *(Integer *)((long)i + lVar9) = IVar6;
          IVar6 = *j;
          *j = *(Integer *)((long)j + lVar9);
          *(Integer *)((long)j + lVar9) = IVar6;
          lVar9 = lVar9 + -8;
        } while (lVar9 != 0);
      }
    }
    break;
  case 0x3eb:
    uVar11 = *pn;
    if (1 < (long)uVar11) {
      uVar13 = uVar11 >> 1;
      uVar11 = (ulong)((uint)uVar11 & 1);
      lVar9 = uVar13 * 0x10 + uVar11 * 8 + -8;
      if (uVar13 != 1) {
        plVar14 = base + uVar11 + uVar13 * 2 + -1;
        do {
          plVar19 = base + (uVar13 - 1) + uVar13;
          plVar12 = base + (uVar13 - 1);
          uVar11 = uVar13;
          while (plVar19 <= plVar14) {
            uVar11 = uVar11 * 2;
            if (plVar19 == plVar14) {
              lVar15 = *plVar14;
              plVar17 = plVar14;
            }
            else {
              lVar18 = *plVar19;
              lVar16 = plVar19[1];
              lVar15 = lVar18;
              if (lVar18 < lVar16) {
                lVar15 = lVar16;
              }
              plVar17 = plVar19 + 1;
              if (lVar16 <= lVar18) {
                plVar17 = plVar19;
              }
              uVar11 = uVar11 | lVar18 < lVar16;
            }
            lVar18 = *plVar12;
            if (lVar15 <= lVar18) break;
            *plVar12 = lVar15;
            *plVar17 = lVar18;
            lVar15 = (long)(int)((ulong)((long)plVar12 - (long)base) >> 3);
            uVar3 = *(undefined4 *)((long)v + lVar15 * 4);
            lVar18 = (long)(int)((ulong)((long)plVar17 - (long)base) >> 3);
            *(undefined4 *)((long)v + lVar15 * 4) = *(undefined4 *)((long)v + lVar18 * 4);
            *(undefined4 *)((long)v + lVar18 * 4) = uVar3;
            IVar6 = i[lVar15];
            i[lVar15] = i[lVar18];
            i[lVar18] = IVar6;
            IVar6 = j[lVar15];
            j[lVar15] = j[lVar18];
            j[lVar18] = IVar6;
            plVar12 = plVar17;
            plVar19 = plVar17 + uVar11;
          }
          uVar13 = uVar13 - 1;
        } while (uVar13 != 1);
      }
      if (lVar9 != 0) {
        do {
          if (7 < lVar9) {
            plVar14 = (long *)((long)base + lVar9);
            uVar11 = 1;
            pIVar10 = base;
            plVar19 = base + 1;
            do {
              uVar11 = uVar11 * 2;
              if (plVar19 == plVar14) {
                lVar15 = *plVar14;
                plVar12 = plVar14;
              }
              else {
                lVar18 = *plVar19;
                lVar16 = plVar19[1];
                lVar15 = lVar18;
                if (lVar18 < lVar16) {
                  lVar15 = lVar16;
                }
                plVar12 = plVar19 + 1;
                if (lVar16 <= lVar18) {
                  plVar12 = plVar19;
                }
                uVar11 = uVar11 | lVar18 < lVar16;
              }
              lVar18 = *pIVar10;
              if (lVar15 <= lVar18) break;
              *pIVar10 = lVar15;
              *plVar12 = lVar18;
              lVar15 = (long)(int)((ulong)((long)pIVar10 - (long)base) >> 3);
              uVar3 = *(undefined4 *)((long)v + lVar15 * 4);
              lVar18 = (long)(int)((ulong)((long)plVar12 - (long)base) >> 3);
              *(undefined4 *)((long)v + lVar15 * 4) = *(undefined4 *)((long)v + lVar18 * 4);
              *(undefined4 *)((long)v + lVar18 * 4) = uVar3;
              IVar6 = i[lVar15];
              i[lVar15] = i[lVar18];
              i[lVar18] = IVar6;
              IVar6 = j[lVar15];
              j[lVar15] = j[lVar18];
              j[lVar18] = IVar6;
              plVar19 = plVar12 + uVar11;
              pIVar10 = plVar12;
            } while (plVar19 <= plVar14);
          }
          IVar6 = *base;
          *base = *(Integer *)((long)base + lVar9);
          *(Integer *)((long)base + lVar9) = IVar6;
          uVar3 = *v;
          lVar15 = (lVar9 << 0x1d) >> 0x1e;
          *(undefined4 *)v = *(undefined4 *)((long)v + lVar15);
          *(undefined4 *)((long)v + lVar15) = uVar3;
          IVar6 = *i;
          lVar15 = (lVar9 << 0x1d) >> 0x1d;
          *i = *(Integer *)((long)i + lVar15);
          *(Integer *)((long)i + lVar15) = IVar6;
          IVar6 = *j;
          *j = *(Integer *)((long)j + lVar15);
          *(Integer *)((long)j + lVar15) = IVar6;
          lVar9 = lVar9 + -8;
        } while (lVar9 != 0);
      }
    }
    break;
  case 0x3ec:
    uVar11 = *pn;
    if (1 < (long)uVar11) {
      uVar13 = uVar11 >> 1;
      uVar11 = (ulong)((uint)uVar11 & 1);
      lVar9 = uVar13 * 0x10 + uVar11 * 8 + -8;
      if (uVar13 != 1) {
        plVar14 = base + uVar11 + uVar13 * 2 + -1;
        do {
          plVar19 = base + (uVar13 - 1) + uVar13;
          plVar12 = base + (uVar13 - 1);
          uVar11 = uVar13;
          while (plVar19 <= plVar14) {
            uVar11 = uVar11 * 2;
            if (plVar19 == plVar14) {
              lVar15 = *plVar14;
              plVar17 = plVar14;
            }
            else {
              lVar18 = *plVar19;
              lVar16 = plVar19[1];
              lVar15 = lVar18;
              if (lVar18 < lVar16) {
                lVar15 = lVar16;
              }
              plVar17 = plVar19 + 1;
              if (lVar16 <= lVar18) {
                plVar17 = plVar19;
              }
              uVar11 = uVar11 | lVar18 < lVar16;
            }
            lVar18 = *plVar12;
            if (lVar15 <= lVar18) break;
            lVar16 = (long)plVar17 - (long)base;
            *plVar12 = lVar15;
            lVar15 = (long)plVar12 - (long)base;
            *plVar17 = lVar18;
            uVar5 = *(undefined8 *)((long)v + lVar15);
            *(undefined8 *)((long)v + lVar15) = *(undefined8 *)((long)v + lVar16);
            *(undefined8 *)((long)v + lVar16) = uVar5;
            uVar5 = *(undefined8 *)((long)i + lVar15);
            *(undefined8 *)((long)i + lVar15) = *(undefined8 *)((long)i + lVar16);
            *(undefined8 *)((long)i + lVar16) = uVar5;
            uVar5 = *(undefined8 *)((long)j + lVar15);
            *(undefined8 *)((long)j + lVar15) = *(undefined8 *)((long)j + lVar16);
            *(undefined8 *)((long)j + lVar16) = uVar5;
            plVar12 = plVar17;
            plVar19 = plVar17 + uVar11;
          }
          uVar13 = uVar13 - 1;
        } while (uVar13 != 1);
      }
      if (lVar9 != 0) {
        do {
          if (7 < lVar9) {
            plVar14 = (long *)((long)base + lVar9);
            uVar11 = 1;
            pIVar10 = base;
            plVar19 = base + 1;
            do {
              uVar11 = uVar11 * 2;
              if (plVar19 == plVar14) {
                lVar15 = *plVar14;
                plVar12 = plVar14;
              }
              else {
                lVar18 = *plVar19;
                lVar16 = plVar19[1];
                lVar15 = lVar18;
                if (lVar18 < lVar16) {
                  lVar15 = lVar16;
                }
                plVar12 = plVar19 + 1;
                if (lVar16 <= lVar18) {
                  plVar12 = plVar19;
                }
                uVar11 = uVar11 | lVar18 < lVar16;
              }
              lVar18 = *pIVar10;
              if (lVar15 <= lVar18) break;
              lVar16 = (long)plVar12 - (long)base;
              *pIVar10 = lVar15;
              lVar15 = (long)pIVar10 - (long)base;
              *plVar12 = lVar18;
              uVar5 = *(undefined8 *)((long)v + lVar15);
              *(undefined8 *)((long)v + lVar15) = *(undefined8 *)((long)v + lVar16);
              *(undefined8 *)((long)v + lVar16) = uVar5;
              uVar5 = *(undefined8 *)((long)i + lVar15);
              *(undefined8 *)((long)i + lVar15) = *(undefined8 *)((long)i + lVar16);
              *(undefined8 *)((long)i + lVar16) = uVar5;
              uVar5 = *(undefined8 *)((long)j + lVar15);
              *(undefined8 *)((long)j + lVar15) = *(undefined8 *)((long)j + lVar16);
              *(undefined8 *)((long)j + lVar16) = uVar5;
              plVar19 = plVar12 + uVar11;
              pIVar10 = plVar12;
            } while (plVar19 <= plVar14);
          }
          IVar6 = *base;
          *base = *(Integer *)((long)base + lVar9);
          *(Integer *)((long)base + lVar9) = IVar6;
          uVar5 = *v;
          *(undefined8 *)v = *(undefined8 *)((long)v + lVar9);
          *(undefined8 *)((long)v + lVar9) = uVar5;
          IVar6 = *i;
          *i = *(Integer *)((long)i + lVar9);
          *(Integer *)((long)i + lVar9) = IVar6;
          IVar6 = *j;
          *j = *(Integer *)((long)j + lVar9);
          *(Integer *)((long)j + lVar9) = IVar6;
          lVar9 = lVar9 + -8;
        } while (lVar9 != 0);
      }
    }
    break;
  default:
    pnga_error("ERROR:ga_sort_scat: wrong type",type);
    return;
  case 0x3ee:
    uVar11 = *pn;
    if (1 < (long)uVar11) {
      uVar13 = uVar11 >> 1;
      uVar11 = (ulong)((uint)uVar11 & 1);
      lVar9 = uVar13 * 0x10 + uVar11 * 8 + -8;
      if (uVar13 != 1) {
        plVar14 = base + uVar11 + uVar13 * 2 + -1;
        do {
          plVar19 = base + (uVar13 - 1) + uVar13;
          plVar12 = base + (uVar13 - 1);
          uVar11 = uVar13;
          while (plVar19 <= plVar14) {
            uVar11 = uVar11 * 2;
            if (plVar19 == plVar14) {
              lVar15 = *plVar14;
              plVar17 = plVar14;
            }
            else {
              lVar18 = *plVar19;
              lVar16 = plVar19[1];
              lVar15 = lVar18;
              if (lVar18 < lVar16) {
                lVar15 = lVar16;
              }
              plVar17 = plVar19 + 1;
              if (lVar16 <= lVar18) {
                plVar17 = plVar19;
              }
              uVar11 = uVar11 | lVar18 < lVar16;
            }
            lVar18 = *plVar12;
            if (lVar15 <= lVar18) break;
            lVar16 = (long)plVar17 - (long)base;
            *plVar12 = lVar15;
            lVar15 = (long)plVar12 - (long)base;
            *plVar17 = lVar18;
            uVar5 = *(undefined8 *)((long)v + lVar15);
            *(undefined8 *)((long)v + lVar15) = *(undefined8 *)((long)v + lVar16);
            *(undefined8 *)((long)v + lVar16) = uVar5;
            uVar5 = *(undefined8 *)((long)i + lVar15);
            *(undefined8 *)((long)i + lVar15) = *(undefined8 *)((long)i + lVar16);
            *(undefined8 *)((long)i + lVar16) = uVar5;
            uVar5 = *(undefined8 *)((long)j + lVar15);
            *(undefined8 *)((long)j + lVar15) = *(undefined8 *)((long)j + lVar16);
            *(undefined8 *)((long)j + lVar16) = uVar5;
            plVar12 = plVar17;
            plVar19 = plVar17 + uVar11;
          }
          uVar13 = uVar13 - 1;
        } while (uVar13 != 1);
      }
      if (lVar9 != 0) {
        do {
          if (7 < lVar9) {
            plVar14 = (long *)((long)base + lVar9);
            uVar11 = 1;
            pIVar10 = base;
            plVar19 = base + 1;
            do {
              uVar11 = uVar11 * 2;
              if (plVar19 == plVar14) {
                lVar15 = *plVar14;
                plVar12 = plVar14;
              }
              else {
                lVar18 = *plVar19;
                lVar16 = plVar19[1];
                lVar15 = lVar18;
                if (lVar18 < lVar16) {
                  lVar15 = lVar16;
                }
                plVar12 = plVar19 + 1;
                if (lVar16 <= lVar18) {
                  plVar12 = plVar19;
                }
                uVar11 = uVar11 | lVar18 < lVar16;
              }
              lVar18 = *pIVar10;
              if (lVar15 <= lVar18) break;
              lVar16 = (long)plVar12 - (long)base;
              *pIVar10 = lVar15;
              lVar15 = (long)pIVar10 - (long)base;
              *plVar12 = lVar18;
              uVar5 = *(undefined8 *)((long)v + lVar15);
              *(undefined8 *)((long)v + lVar15) = *(undefined8 *)((long)v + lVar16);
              *(undefined8 *)((long)v + lVar16) = uVar5;
              uVar5 = *(undefined8 *)((long)i + lVar15);
              *(undefined8 *)((long)i + lVar15) = *(undefined8 *)((long)i + lVar16);
              *(undefined8 *)((long)i + lVar16) = uVar5;
              uVar5 = *(undefined8 *)((long)j + lVar15);
              *(undefined8 *)((long)j + lVar15) = *(undefined8 *)((long)j + lVar16);
              *(undefined8 *)((long)j + lVar16) = uVar5;
              plVar19 = plVar12 + uVar11;
              pIVar10 = plVar12;
            } while (plVar19 <= plVar14);
          }
          IVar6 = *base;
          *base = *(Integer *)((long)base + lVar9);
          *(Integer *)((long)base + lVar9) = IVar6;
          uVar5 = *v;
          *(undefined8 *)v = *(undefined8 *)((long)v + lVar9);
          *(undefined8 *)((long)v + lVar9) = uVar5;
          IVar6 = *i;
          *i = *(Integer *)((long)i + lVar9);
          *(Integer *)((long)i + lVar9) = IVar6;
          IVar6 = *j;
          *j = *(Integer *)((long)j + lVar9);
          *(Integer *)((long)j + lVar9) = IVar6;
          lVar9 = lVar9 + -8;
        } while (lVar9 != 0);
      }
    }
    break;
  case 0x3ef:
    uVar11 = *pn;
    if (1 < (long)uVar11) {
      uVar13 = uVar11 >> 1;
      uVar11 = (ulong)((uint)uVar11 & 1);
      lVar9 = uVar13 * 0x10 + uVar11 * 8 + -8;
      if (uVar13 != 1) {
        plVar14 = base + uVar11 + uVar13 * 2 + -1;
        do {
          plVar19 = base + (uVar13 - 1) + uVar13;
          plVar12 = base + (uVar13 - 1);
          uVar11 = uVar13;
          while (plVar19 <= plVar14) {
            uVar11 = uVar11 * 2;
            if (plVar19 == plVar14) {
              lVar15 = *plVar14;
              plVar17 = plVar14;
            }
            else {
              lVar18 = *plVar19;
              lVar16 = plVar19[1];
              lVar15 = lVar18;
              if (lVar18 < lVar16) {
                lVar15 = lVar16;
              }
              plVar17 = plVar19 + 1;
              if (lVar16 <= lVar18) {
                plVar17 = plVar19;
              }
              uVar11 = uVar11 | lVar18 < lVar16;
            }
            lVar18 = *plVar12;
            if (lVar15 <= lVar18) break;
            lVar16 = (long)plVar17 - (long)base;
            *plVar12 = lVar15;
            lVar15 = (long)plVar12 - (long)base;
            *plVar17 = lVar18;
            puVar1 = (undefined8 *)((long)v + lVar15 * 2);
            uVar5 = *puVar1;
            uVar7 = puVar1[1];
            puVar1 = (undefined8 *)((long)v + lVar16 * 2);
            uVar8 = puVar1[1];
            puVar2 = (undefined8 *)((long)v + lVar15 * 2);
            *puVar2 = *puVar1;
            puVar2[1] = uVar8;
            puVar1 = (undefined8 *)((long)v + lVar16 * 2);
            *puVar1 = uVar5;
            puVar1[1] = uVar7;
            uVar5 = *(undefined8 *)((long)i + lVar15);
            *(undefined8 *)((long)i + lVar15) = *(undefined8 *)((long)i + lVar16);
            *(undefined8 *)((long)i + lVar16) = uVar5;
            uVar5 = *(undefined8 *)((long)j + lVar15);
            *(undefined8 *)((long)j + lVar15) = *(undefined8 *)((long)j + lVar16);
            *(undefined8 *)((long)j + lVar16) = uVar5;
            plVar12 = plVar17;
            plVar19 = plVar17 + uVar11;
          }
          uVar13 = uVar13 - 1;
        } while (uVar13 != 1);
      }
      if (lVar9 != 0) {
        do {
          if (7 < lVar9) {
            plVar14 = (long *)((long)base + lVar9);
            uVar11 = 1;
            pIVar10 = base;
            plVar19 = base + 1;
            do {
              uVar11 = uVar11 * 2;
              if (plVar19 == plVar14) {
                lVar15 = *plVar14;
                plVar12 = plVar14;
              }
              else {
                lVar18 = *plVar19;
                lVar16 = plVar19[1];
                lVar15 = lVar18;
                if (lVar18 < lVar16) {
                  lVar15 = lVar16;
                }
                plVar12 = plVar19 + 1;
                if (lVar16 <= lVar18) {
                  plVar12 = plVar19;
                }
                uVar11 = uVar11 | lVar18 < lVar16;
              }
              lVar18 = *pIVar10;
              if (lVar15 <= lVar18) break;
              lVar16 = (long)plVar12 - (long)base;
              *pIVar10 = lVar15;
              lVar15 = (long)pIVar10 - (long)base;
              *plVar12 = lVar18;
              puVar1 = (undefined8 *)((long)v + lVar15 * 2);
              uVar5 = *puVar1;
              uVar7 = puVar1[1];
              puVar1 = (undefined8 *)((long)v + lVar16 * 2);
              uVar8 = puVar1[1];
              puVar2 = (undefined8 *)((long)v + lVar15 * 2);
              *puVar2 = *puVar1;
              puVar2[1] = uVar8;
              puVar1 = (undefined8 *)((long)v + lVar16 * 2);
              *puVar1 = uVar5;
              puVar1[1] = uVar7;
              uVar5 = *(undefined8 *)((long)i + lVar15);
              *(undefined8 *)((long)i + lVar15) = *(undefined8 *)((long)i + lVar16);
              *(undefined8 *)((long)i + lVar16) = uVar5;
              uVar5 = *(undefined8 *)((long)j + lVar15);
              *(undefined8 *)((long)j + lVar15) = *(undefined8 *)((long)j + lVar16);
              *(undefined8 *)((long)j + lVar16) = uVar5;
              plVar19 = plVar12 + uVar11;
              pIVar10 = plVar12;
            } while (plVar19 <= plVar14);
          }
          IVar6 = *base;
          *base = *(Integer *)((long)base + lVar9);
          *(Integer *)((long)base + lVar9) = IVar6;
          uVar5 = *v;
          uVar7 = *(undefined8 *)((long)v + 8);
          puVar1 = (undefined8 *)((long)v + lVar9 * 2);
          uVar8 = puVar1[1];
          *(undefined8 *)v = *puVar1;
          *(undefined8 *)((long)v + 8) = uVar8;
          puVar1 = (undefined8 *)((long)v + lVar9 * 2);
          *puVar1 = uVar5;
          puVar1[1] = uVar7;
          IVar6 = *i;
          *i = *(Integer *)((long)i + lVar9);
          *(Integer *)((long)i + lVar9) = IVar6;
          IVar6 = *j;
          *j = *(Integer *)((long)j + lVar9);
          *(Integer *)((long)j + lVar9) = IVar6;
          lVar9 = lVar9 + -8;
        } while (lVar9 != 0);
      }
    }
  }
  return;
}

Assistant:

void ga_sort_scat(pn, v, i, j, base, type)
     Integer *pn;
     void    *v;
     Integer *i;
     Integer *j;
     Integer *base;
     Integer type;
{ 
   switch (type){
     case C_DBL:  ga_sort_scat_dbl_(pn, (double*)v, i,j,base);break;
     case C_DCPL: ga_sort_scat_dcpl_(pn, (DoubleComplex*)v, i,j,base); break;
     case C_SCPL: ga_sort_scat_scpl_(pn, (SingleComplex*)v, i,j,base); break;
     case C_INT:  ga_sort_scat_int_(pn, (int*)v, i, j, base); break;
     case C_FLOAT:  ga_sort_scat_flt_(pn, (float*)v, i, j, base); break; 
     case C_LONG:  ga_sort_scat_long_(pn, (long*)v, i, j, base); break;
     default:        pnga_error("ERROR:ga_sort_scat: wrong type",type);
   } 
}